

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStringConstant
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,Var var)

{
  charcount_t cVar1;
  uint32 uVar2;
  JavascriptString *this_00;
  ByteBuffer *bb;
  anon_union_8_3_52f0de8f_for_ByteBuffer_1 aVar3;
  undefined4 extraout_var;
  
  this_00 = VarTo<Js::JavascriptString>(var);
  bb = (ByteBuffer *)new<Memory::ArenaAllocator>(0x10,this->alloc,0x35916e);
  cVar1 = JavascriptString::GetLength(this_00);
  aVar3._0_4_ = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this_00);
  aVar3._4_4_ = extraout_var;
  bb->byteCount = cVar1 * 2 + 2;
  bb->field_1 = aVar3;
  uVar2 = PrependByteBuffer(this,builder,L"String Constant 16 Value",bb);
  return uVar2;
}

Assistant:

uint32 PrependStringConstant(BufferBuilderList & builder, Var var)
    {
        auto str = VarTo<JavascriptString>(var);
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start String Constant"), magicStartStringConstant);
#endif
        auto bb = Anew(alloc, ByteBuffer, (str->GetLength() + 1) * sizeof(char16), (void*)str->GetSz());
        size += PrependByteBuffer(builder, _u("String Constant 16 Value"), bb);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End String Constant"), magicEndStringConstant);
#endif

        return size;
    }